

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Syn2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  If_DsdMan_t *p_00;
  Gia_Man_t *pNew;
  char *pcVar2;
  If_DsdMan_t *p;
  int fVeryVerbose;
  int fDelayMin;
  int nRelaxRatio;
  int fCutMin;
  int fCoarsen;
  int fOldAlgo;
  int fVerbose;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fCoarsen = 0;
  fCutMin = 0;
  nRelaxRatio = 1;
  fDelayMin = 0;
  fVeryVerbose = 0x14;
  p._4_4_ = 0;
  p._0_4_ = 0;
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"Rakmdvwh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Syn2(): There is no AIG.\n");
        return 1;
      }
      if (((p._4_4_ != 0) &&
          (p_00 = (If_DsdMan_t *)Abc_FrameReadManDsd(), p_00 != (If_DsdMan_t *)0x0)) &&
         (iVar1 = If_DsdManVarNum(p_00), iVar1 < 6)) {
        printf(
              "DSD manager has incompatible number of variables. Delay minimization is not performed.\n"
              );
        p._4_4_ = 0;
      }
      pNew = Gia_ManAigSyn2(pAbc->pGia,fCutMin,nRelaxRatio,fDelayMin,fVeryVerbose,p._4_4_,fCoarsen,
                            (uint)p);
      Abc_FrameUpdateGia(pAbc,pNew);
      return 0;
    }
    switch(iVar1) {
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(1,"Command line switch \"-R\" should be followed by a floating point number.\n");
        return 0;
      }
      fVeryVerbose = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fVeryVerbose < 0) {
LAB_00260b14:
        Abc_Print(-2,"usage: &syn2 [-R num] [-akmdvh]\n");
        Abc_Print(-2,"\t           performs AIG optimization\n");
        Abc_Print(-2,"\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",
                  (ulong)(uint)fVeryVerbose);
        pcVar2 = "no";
        if (fCutMin != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-a       : toggles using the old algorithm [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if (nRelaxRatio != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-k       : toggles coarsening the subject graph [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if (fDelayMin != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-m       : toggles cut minimization [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if (p._4_4_ != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-d       : toggles additional delay optimization [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if (fCoarsen != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-v       : toggles printing verbose information [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if ((uint)p != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-w       : toggles printing additional information [default = %s]\n",pcVar2)
        ;
        Abc_Print(-2,"\t-h       : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_00260b14;
    case 0x61:
      fCutMin = fCutMin ^ 1;
      break;
    case 100:
      p._4_4_ = p._4_4_ ^ 1;
      break;
    case 0x68:
      goto LAB_00260b14;
    case 0x6b:
      nRelaxRatio = nRelaxRatio ^ 1;
      break;
    case 0x6d:
      fDelayMin = fDelayMin ^ 1;
      break;
    case 0x76:
      fCoarsen = fCoarsen ^ 1;
      break;
    case 0x77:
      p._0_4_ = (uint)p ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Syn2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, fVerbose  =  0;
    int fOldAlgo     =  0;
    int fCoarsen     =  1;
    int fCutMin      =  0;
    int nRelaxRatio  = 20;
    int fDelayMin    =  0;
    int fVeryVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Rakmdvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRelaxRatio < 0 ) 
                goto usage;
            break;
        case 'a':
            fOldAlgo ^= 1;
            break;
        case 'k':
            fCoarsen ^= 1;
            break;
        case 'm':
            fCutMin ^= 1;
            break;
        case 'd':
            fDelayMin ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Syn2(): There is no AIG.\n" );
        return 1;
    }
    if ( fDelayMin )
    {
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( p && If_DsdManVarNum(p) < 6 )
        {
            printf( "DSD manager has incompatible number of variables. Delay minimization is not performed.\n" );
            fDelayMin = 0;
        }
    } 
    pTemp = Gia_ManAigSyn2( pAbc->pGia, fOldAlgo, fCoarsen, fCutMin, nRelaxRatio, fDelayMin, fVerbose, fVeryVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &syn2 [-R num] [-akmdvh]\n" );
    Abc_Print( -2, "\t           performs AIG optimization\n" );
    Abc_Print( -2, "\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",   nRelaxRatio );
    Abc_Print( -2, "\t-a       : toggles using the old algorithm [default = %s]\n",         fOldAlgo? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles coarsening the subject graph [default = %s]\n",    fCoarsen? "yes": "no" );
    Abc_Print( -2, "\t-m       : toggles cut minimization [default = %s]\n",                fCutMin? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggles additional delay optimization [default = %s]\n",   fDelayMin? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles printing verbose information [default = %s]\n",    fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles printing additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}